

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O3

double Gia_SweeperMemUsage(Gia_Man_t *pGia)

{
  void *pvVar1;
  
  pvVar1 = pGia->pData;
  return ((double)**(int **)((long)pvVar1 + 0x48) +
         (double)**(int **)((long)pvVar1 + 0x40) +
         (double)**(int **)((long)pvVar1 + 0x38) +
         (double)**(int **)((long)pvVar1 + 0x30) +
         (double)**(int **)((long)pvVar1 + 0x20) +
         (double)**(int **)((long)pvVar1 + 0x18) + (double)**(int **)((long)pvVar1 + 0x10) + 168.0)
         * 4.0;
}

Assistant:

double Gia_SweeperMemUsage( Gia_Man_t * pGia )
{
    Swp_Man_t * p = (Swp_Man_t *)pGia->pData;
    double nMem = sizeof(Swp_Man_t);
    nMem += Vec_IntCap(p->vProbes);
    nMem += Vec_IntCap(p->vCondProbes);
    nMem += Vec_IntCap(p->vCondAssump);
    nMem += Vec_IntCap(p->vId2Lit);
    nMem += Vec_IntCap(p->vFront);
    nMem += Vec_IntCap(p->vFanins);
    nMem += Vec_IntCap(p->vCexSwp);
    return 4.0 * nMem;
}